

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

bool __thiscall QTextBrowser::focusNextPrevChild(QTextBrowser *this,bool next)

{
  bool bVar1;
  undefined8 in_RDI;
  QTextBrowserPrivate *d;
  undefined1 next_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  next_00 = (undefined1)((ulong)in_RDI >> 0x38);
  d_func((QTextBrowser *)0x6df264);
  bVar1 = QWidgetTextControl::setFocusToNextOrPreviousAnchor
                    ((QWidgetTextControl *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(bool)next_00);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = QTextEdit::focusNextPrevChild
                      ((QTextEdit *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (bool)next_00);
  }
  return bVar1;
}

Assistant:

bool QTextBrowser::focusNextPrevChild(bool next)
{
    Q_D(QTextBrowser);
    if (d->control->setFocusToNextOrPreviousAnchor(next)) {
#ifdef QT_KEYPAD_NAVIGATION
        // Might need to synthesize a highlight event.
        if (d->prevFocus != d->control->textCursor() && d->control->textCursor().hasSelection()) {
            const QString href = d->control->anchorAtCursor();
            QUrl url = d->resolveUrl(href);
            emitHighlighted(url);
        }
        d->prevFocus = d->control->textCursor();
#endif
        return true;
    } else {
#ifdef QT_KEYPAD_NAVIGATION
        // We assume we have no highlight now.
        emitHighlighted(QUrl());
#endif
    }
    return QTextEdit::focusNextPrevChild(next);
}